

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
Service_AddNodes_existing
          (UA_Server *server,UA_Session *session,UA_Node *node,UA_NodeId *parentNodeId,
          UA_NodeId *referenceTypeId,UA_NodeId *typeDefinition,
          UA_InstantiationCallback *instantiationCallback,UA_NodeId *addedNodeId)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  char cVar9;
  ushort uVar10;
  ushort uVar11;
  UA_NodeClass UVar12;
  UA_UInt32 UVar13;
  uint uVar14;
  uint uVar15;
  UA_SecureChannel *pUVar16;
  void *data;
  undefined2 uVar17;
  undefined2 uVar18;
  undefined4 uVar19;
  size_t sVar20;
  undefined2 uVar21;
  undefined2 uVar22;
  undefined4 uVar23;
  undefined2 uVar24;
  undefined2 uVar25;
  undefined4 uVar26;
  UA_NodeId *p;
  undefined8 size;
  UA_Boolean UVar27;
  UA_StatusCode UVar28;
  UA_StatusCode UVar29;
  UA_Node *pUVar30;
  UA_Node *pUVar31;
  char *pcVar32;
  UA_Int32 UVar33;
  ulong uVar34;
  char *msg;
  ulong uVar35;
  UA_Logger p_Var36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  UA_NodeStore *pUVar41;
  ulong uVar42;
  undefined8 uVar43;
  ulong uVar44;
  UA_NodeId *sourceNodeId;
  ulong uVar45;
  bool bVar46;
  UA_UInt16 UStack_168;
  undefined2 uStack_166;
  UA_NodeIdType UStack_164;
  UA_NodeId subtypeId;
  undefined1 local_e8 [8];
  UA_NodeId id_1;
  UA_NodeId basedatavariabletype;
  UA_NodeId baseobjecttype;
  size_t hierarchySize;
  uint local_8c;
  ulong local_58;
  ulong local_48;
  UA_NodeId *local_40;
  ulong local_38;
  
  if (server->namespacesSize <= (ulong)(node->nodeId).namespaceIndex) {
    pUVar16 = session->channel;
    if (pUVar16 == (UA_SecureChannel *)0x0) {
      uVar34 = 0;
      uVar37 = 0;
    }
    else {
      if (pUVar16->connection == (UA_Connection *)0x0) {
        uVar34 = 0;
      }
      else {
        uVar34 = (ulong)(uint)pUVar16->connection->sockfd;
      }
      uVar37 = (ulong)(pUVar16->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Namespace invalid"
                ,uVar34,uVar37,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,
                (ulong)(session->sessionId).identifier.guid.data4[0],
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7]);
    UA_NodeStore_deleteNode(node);
    return 0x80330000;
  }
  UVar12 = node->nodeClass;
  if (((UVar12 == UA_NODECLASS_OBJECT) && (UVar27 = UA_NodeId_isNull(parentNodeId), UVar27)) &&
     (UVar27 = UA_NodeId_isNull(referenceTypeId), UVar27)) {
    pUVar41 = server->nodestore;
    goto LAB_0011d379;
  }
  pUVar41 = server->nodestore;
  pUVar31 = UA_NodeStore_get(pUVar41,parentNodeId);
  if (pUVar31 == (UA_Node *)0x0) {
    p_Var36 = (server->config).logger;
    pUVar16 = session->channel;
    if (pUVar16 == (UA_SecureChannel *)0x0) {
      uVar34 = 0;
      uVar37 = 0;
    }
    else {
      if (pUVar16->connection == (UA_Connection *)0x0) {
        uVar34 = 0;
      }
      else {
        uVar34 = (ulong)(uint)pUVar16->connection->sockfd;
      }
      uVar37 = (ulong)(pUVar16->securityToken).channelId;
    }
    uVar14 = (session->sessionId).identifier.numeric;
    uVar10 = (session->sessionId).identifier.guid.data2;
    uVar11 = (session->sessionId).identifier.guid.data3;
    bVar8 = (session->sessionId).identifier.guid.data4[0];
    bVar1 = (session->sessionId).identifier.guid.data4[1];
    bVar2 = (session->sessionId).identifier.guid.data4[2];
    bVar3 = (session->sessionId).identifier.guid.data4[3];
    bVar4 = (session->sessionId).identifier.guid.data4[4];
    bVar5 = (session->sessionId).identifier.guid.data4[5];
    bVar6 = (session->sessionId).identifier.guid.data4[6];
    bVar7 = (session->sessionId).identifier.guid.data4[7];
    pcVar32 = 
    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Parent node not found"
    ;
LAB_0011d6c6:
    local_38 = (ulong)uVar11;
    local_40 = (UA_NodeId *)(ulong)bVar8;
    local_48 = (ulong)uVar10;
    local_58 = (ulong)bVar1;
    UA_LOG_INFO(p_Var36,UA_LOGCATEGORY_SESSION,pcVar32,uVar34,uVar37,(ulong)uVar14,local_48,local_38
                ,local_40,local_58,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,(ulong)bVar5,(ulong)bVar6,
                (ulong)bVar7);
    UVar28 = 0x805b0000;
    goto LAB_0011dc8a;
  }
  pUVar30 = UA_NodeStore_get(pUVar41,referenceTypeId);
  if (pUVar30 == (UA_Node *)0x0) {
    p_Var36 = (server->config).logger;
    pUVar16 = session->channel;
    if (pUVar16 == (UA_SecureChannel *)0x0) {
      uVar34 = 0;
      uVar37 = 0;
    }
    else {
      if (pUVar16->connection == (UA_Connection *)0x0) {
        uVar34 = 0;
      }
      else {
        uVar34 = (ulong)(uint)pUVar16->connection->sockfd;
      }
      uVar37 = (ulong)(pUVar16->securityToken).channelId;
    }
    uVar38 = (ulong)(session->sessionId).identifier.numeric;
    local_48 = (ulong)(session->sessionId).identifier.guid.data2;
    local_38 = (ulong)(session->sessionId).identifier.guid.data3;
    local_40 = (UA_NodeId *)(ulong)(session->sessionId).identifier.guid.data4[0];
    local_58 = (ulong)(session->sessionId).identifier.guid.data4[1];
    uVar42 = (ulong)(session->sessionId).identifier.guid.data4[2];
    uVar45 = (ulong)(session->sessionId).identifier.guid.data4[3];
    uVar44 = (ulong)(session->sessionId).identifier.guid.data4[4];
    uVar39 = (ulong)(session->sessionId).identifier.guid.data4[5];
    uVar40 = (ulong)(session->sessionId).identifier.guid.data4[6];
    uVar35 = (ulong)(session->sessionId).identifier.guid.data4[7];
    pcVar32 = 
    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Reference type to the parent not found"
    ;
  }
  else {
    if (pUVar30->nodeClass == UA_NODECLASS_REFERENCETYPE) {
      if ((char)pUVar30[1].nodeId.namespaceIndex == '\x01') {
        p_Var36 = (server->config).logger;
        pUVar16 = session->channel;
        if (pUVar16 == (UA_SecureChannel *)0x0) {
          uVar34 = 0;
          uVar37 = 0;
        }
        else {
          if (pUVar16->connection == (UA_Connection *)0x0) {
            uVar34 = 0;
          }
          else {
            uVar34 = (ulong)(uint)pUVar16->connection->sockfd;
          }
          uVar37 = (ulong)(pUVar16->securityToken).channelId;
        }
        uVar14 = (session->sessionId).identifier.numeric;
        uVar10 = (session->sessionId).identifier.guid.data2;
        uVar11 = (session->sessionId).identifier.guid.data3;
        bVar8 = (session->sessionId).identifier.guid.data4[0];
        bVar7 = (session->sessionId).identifier.guid.data4[1];
        bVar6 = (session->sessionId).identifier.guid.data4[2];
        bVar5 = (session->sessionId).identifier.guid.data4[3];
        bVar1 = (session->sessionId).identifier.guid.data4[4];
        bVar4 = (session->sessionId).identifier.guid.data4[5];
        bVar3 = (session->sessionId).identifier.guid.data4[6];
        bVar2 = (session->sessionId).identifier.guid.data4[7];
        pcVar32 = 
        "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Abstract reference type to the parent not allowed"
        ;
LAB_0011dc60:
        local_38 = (ulong)uVar11;
        local_40 = (UA_NodeId *)(ulong)bVar8;
        local_48 = (ulong)uVar10;
        local_58 = (ulong)bVar7;
        UA_LOG_INFO(p_Var36,UA_LOGCATEGORY_SESSION,pcVar32,uVar34,uVar37,(ulong)uVar14,local_48,
                    local_38,local_40,local_58,(ulong)bVar6,(ulong)bVar5,(ulong)bVar1,(ulong)bVar4,
                    (ulong)bVar3,(ulong)bVar2);
        UVar28 = 0x805c0000;
        goto LAB_0011dc8a;
      }
      UStack_168 = 0;
      UStack_164 = UA_NODEIDTYPE_NUMERIC;
      subtypeId.namespaceIndex = 0x2d;
      subtypeId._2_2_ = 0;
      uVar14 = UVar12 - UA_NODECLASS_OBJECTTYPE >> 3;
      if (((UVar12 << 0x1d | uVar14) < 8) && ((0x8bU >> (uVar14 & 0x1f) & 1) != 0)) {
        UVar27 = UA_NodeId_equal(referenceTypeId,(UA_NodeId *)&stack0xfffffffffffffe98);
        if (!UVar27) {
          p_Var36 = (server->config).logger;
          pUVar16 = session->channel;
          if (pUVar16 == (UA_SecureChannel *)0x0) {
            uVar34 = 0;
            uVar37 = 0;
          }
          else {
            if (pUVar16->connection == (UA_Connection *)0x0) {
              uVar34 = 0;
            }
            else {
              uVar34 = (ulong)(uint)pUVar16->connection->sockfd;
            }
            uVar37 = (ulong)(pUVar16->securityToken).channelId;
          }
          uVar14 = (session->sessionId).identifier.numeric;
          uVar10 = (session->sessionId).identifier.guid.data2;
          uVar11 = (session->sessionId).identifier.guid.data3;
          bVar8 = (session->sessionId).identifier.guid.data4[0];
          bVar7 = (session->sessionId).identifier.guid.data4[1];
          bVar6 = (session->sessionId).identifier.guid.data4[2];
          bVar5 = (session->sessionId).identifier.guid.data4[3];
          bVar1 = (session->sessionId).identifier.guid.data4[4];
          bVar4 = (session->sessionId).identifier.guid.data4[5];
          bVar3 = (session->sessionId).identifier.guid.data4[6];
          bVar2 = (session->sessionId).identifier.guid.data4[7];
          pcVar32 = 
          "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: New type node need to have a HasSubType reference"
          ;
          goto LAB_0011dc60;
        }
        if (pUVar31->nodeClass != UVar12) {
          p_Var36 = (server->config).logger;
          pUVar16 = session->channel;
          if (pUVar16 == (UA_SecureChannel *)0x0) {
            uVar34 = 0;
            uVar37 = 0;
          }
          else {
            if (pUVar16->connection == (UA_Connection *)0x0) {
              uVar34 = 0;
            }
            else {
              uVar34 = (ulong)(uint)pUVar16->connection->sockfd;
            }
            uVar37 = (ulong)(pUVar16->securityToken).channelId;
          }
          uVar14 = (session->sessionId).identifier.numeric;
          uVar10 = (session->sessionId).identifier.guid.data2;
          uVar11 = (session->sessionId).identifier.guid.data3;
          bVar8 = (session->sessionId).identifier.guid.data4[0];
          bVar1 = (session->sessionId).identifier.guid.data4[1];
          bVar2 = (session->sessionId).identifier.guid.data4[2];
          bVar3 = (session->sessionId).identifier.guid.data4[3];
          bVar4 = (session->sessionId).identifier.guid.data4[4];
          bVar5 = (session->sessionId).identifier.guid.data4[5];
          bVar6 = (session->sessionId).identifier.guid.data4[6];
          bVar7 = (session->sessionId).identifier.guid.data4[7];
          pcVar32 = 
          "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: New type node needs to be of the same node type as the parent"
          ;
          goto LAB_0011d6c6;
        }
      }
      else {
        local_e8._0_2_ = 0;
        local_e8._4_4_ = UA_NODEIDTYPE_NUMERIC;
        id_1.namespaceIndex = 0x21;
        id_1._2_2_ = 0;
        UVar27 = isNodeInTree(pUVar41,referenceTypeId,(UA_NodeId *)local_e8,
                              (UA_NodeId *)&stack0xfffffffffffffe98,1);
        if (!UVar27) {
          p_Var36 = (server->config).logger;
          pUVar16 = session->channel;
          if (pUVar16 == (UA_SecureChannel *)0x0) {
            uVar34 = 0;
            uVar37 = 0;
          }
          else {
            if (pUVar16->connection == (UA_Connection *)0x0) {
              uVar34 = 0;
            }
            else {
              uVar34 = (ulong)(uint)pUVar16->connection->sockfd;
            }
            uVar37 = (ulong)(pUVar16->securityToken).channelId;
          }
          uVar38 = (ulong)(session->sessionId).identifier.numeric;
          local_48 = (ulong)(session->sessionId).identifier.guid.data2;
          local_38 = (ulong)(session->sessionId).identifier.guid.data3;
          local_40 = (UA_NodeId *)(ulong)(session->sessionId).identifier.guid.data4[0];
          local_58 = (ulong)(session->sessionId).identifier.guid.data4[1];
          uVar42 = (ulong)(session->sessionId).identifier.guid.data4[2];
          uVar45 = (ulong)(session->sessionId).identifier.guid.data4[3];
          uVar44 = (ulong)(session->sessionId).identifier.guid.data4[4];
          uVar39 = (ulong)(session->sessionId).identifier.guid.data4[5];
          uVar40 = (ulong)(session->sessionId).identifier.guid.data4[6];
          uVar35 = (ulong)(session->sessionId).identifier.guid.data4[7];
          pcVar32 = 
          "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Reference type is not hierarchical"
          ;
          goto LAB_0011d83f;
        }
      }
LAB_0011d379:
      UVar28 = UA_NodeStore_insert(pUVar41,node);
      if (UVar28 != 0) {
        p_Var36 = (server->config).logger;
        pUVar16 = session->channel;
        if (pUVar16 == (UA_SecureChannel *)0x0) {
          UVar33 = 0;
          UVar13 = 0;
        }
        else {
          if (pUVar16->connection == (UA_Connection *)0x0) {
            UVar33 = 0;
          }
          else {
            UVar33 = pUVar16->connection->sockfd;
          }
          UVar13 = (pUVar16->securityToken).channelId;
        }
        uVar14 = (session->sessionId).identifier.numeric;
        uVar10 = (session->sessionId).identifier.guid.data2;
        uVar11 = (session->sessionId).identifier.guid.data3;
        bVar1 = (session->sessionId).identifier.guid.data4[0];
        bVar2 = (session->sessionId).identifier.guid.data4[1];
        bVar3 = (session->sessionId).identifier.guid.data4[2];
        bVar4 = (session->sessionId).identifier.guid.data4[3];
        bVar5 = (session->sessionId).identifier.guid.data4[4];
        bVar6 = (session->sessionId).identifier.guid.data4[5];
        bVar7 = (session->sessionId).identifier.guid.data4[6];
        bVar8 = (session->sessionId).identifier.guid.data4[7];
        pcVar32 = UA_StatusCode_name(UVar28);
        UA_LOG_INFO(p_Var36,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Node could not be added to the nodestore with error code %s"
                    ,UVar33,UVar13,(ulong)uVar14,(ulong)uVar10,(ulong)uVar11,(ulong)bVar1,
                    (ulong)bVar2,(ulong)bVar3,(ulong)bVar4,(ulong)bVar5,(ulong)bVar6,(ulong)bVar7,
                    (ulong)bVar8,pcVar32);
        return UVar28;
      }
      if ((addedNodeId != (UA_NodeId *)0x0) &&
         (UVar28 = UA_NodeId_copy(&node->nodeId,addedNodeId), UVar28 != 0)) {
        pUVar16 = session->channel;
        if (pUVar16 == (UA_SecureChannel *)0x0) {
          uVar34 = 0;
          uVar37 = 0;
        }
        else {
          if (pUVar16->connection == (UA_Connection *)0x0) {
            uVar34 = 0;
          }
          else {
            uVar34 = (ulong)(uint)pUVar16->connection->sockfd;
          }
          uVar37 = (ulong)(pUVar16->securityToken).channelId;
        }
        UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not copy the nodeid"
                    ,uVar34,uVar37,(ulong)(session->sessionId).identifier.numeric,
                    (ulong)(session->sessionId).identifier.guid.data2,
                    (ulong)(session->sessionId).identifier.guid.data3,
                    (ulong)(session->sessionId).identifier.guid.data4[0],
                    (ulong)(session->sessionId).identifier.guid.data4[1],
                    (ulong)(session->sessionId).identifier.guid.data4[2],
                    (ulong)(session->sessionId).identifier.guid.data4[3],
                    (ulong)(session->sessionId).identifier.guid.data4[4],
                    (ulong)(session->sessionId).identifier.guid.data4[5],
                    (ulong)(session->sessionId).identifier.guid.data4[6],
                    (ulong)(session->sessionId).identifier.guid.data4[7]);
        goto LAB_0011e2b8;
      }
      UVar27 = UA_NodeId_isNull(parentNodeId);
      if (UVar27) {
LAB_0011d967:
        id_1.identifier._8_2_ = 0;
        stack0xffffffffffffff34 = 0x3f00000000;
        basedatavariabletype.identifier._8_2_ = 0;
        stack0xffffffffffffff4c = 0x3a00000000;
        UVar12 = node->nodeClass;
        local_40 = typeDefinition;
        if (1 < UVar12 - UA_NODECLASS_OBJECT) goto LAB_0011e191;
        if ((typeDefinition == (UA_NodeId *)0x0) ||
           (UVar27 = UA_NodeId_isNull(typeDefinition), UVar27)) {
          local_40 = (UA_NodeId *)((long)&basedatavariabletype.identifier + 8);
          if (UVar12 == UA_NODECLASS_VARIABLE) {
            local_40 = (UA_NodeId *)((long)&id_1.identifier + 8);
          }
        }
        pUVar41 = server->nodestore;
        pUVar31 = UA_NodeStore_get(pUVar41,local_40);
        UVar28 = 0x80630000;
        if (pUVar31 != (UA_Node *)0x0) {
          if (UVar12 == UA_NODECLASS_VARIABLE) {
            if (pUVar31->nodeClass == UA_NODECLASS_VARIABLETYPE) {
              cVar9 = (char)pUVar31[2].browseName.namespaceIndex;
joined_r0x0011dee5:
              if (cVar9 == '\0') {
                local_e8._0_2_ = 0;
                local_e8._2_2_ = 0;
                local_e8._4_4_ = UA_NODEIDTYPE_NUMERIC;
                baseobjecttype.identifier.string.data = (UA_Byte *)0x0;
                UVar28 = getTypeHierarchy(pUVar41,pUVar31,true,(UA_NodeId **)local_e8,
                                          (size_t *)baseobjecttype.identifier.guid.data4);
                size = baseobjecttype.identifier.string.data;
                if (UVar28 == 0) {
                  UVar28 = 0;
                  p = (UA_NodeId *)CONCAT44(local_e8._4_4_,CONCAT22(local_e8._2_2_,local_e8._0_2_));
                  uVar43 = baseobjecttype.identifier.string.data;
                  sourceNodeId = p;
                  while (bVar46 = (UA_Byte *)uVar43 != (UA_Byte *)0x0, uVar43 = uVar43 + -1, bVar46)
                  {
                    UVar29 = copyChildNodesToNode
                                       (server,session,sourceNodeId,&node->nodeId,
                                        instantiationCallback);
                    UVar28 = UVar28 | UVar29;
                    sourceNodeId = sourceNodeId + 1;
                  }
                  UA_Array_delete(p,size,UA_TYPES + 0x10);
                  if (UVar28 == 0) {
                    if ((pUVar31->nodeClass == UA_NODECLASS_OBJECTTYPE) &&
                       (data = (void *)pUVar31[1].nodeId.identifier.string.length,
                       data != (void *)0x0)) {
                      UA_Server_editNode(server,session,&node->nodeId,setObjectInstanceHandle,data);
                    }
                    subtypeId.identifier._10_2_ = 0;
                    uVar24 = (node->nodeId).namespaceIndex;
                    uVar25 = *(undefined2 *)&(node->nodeId).field_0x2;
                    uVar26 = (node->nodeId).identifierType;
                    sVar20 = (node->nodeId).identifier.string.length;
                    subtypeId._0_4_ = SUB84(sVar20,0);
                    subtypeId.identifierType = (UA_NodeIdType)(sVar20 >> 0x20);
                    subtypeId.identifier.string.length =
                         (size_t)(node->nodeId).identifier.string.data;
                    subtypeId.identifier._8_2_ = 0;
                    subtypeId.identifier._12_4_ = 0;
                    UStack_168 = uVar24;
                    uStack_166 = uVar25;
                    UStack_164 = uVar26;
                    UVar28 = addReference(server,session,
                                          (UA_AddReferencesItem *)&stack0xfffffffffffffe98);
                    if (UVar28 == 0) {
LAB_0011e191:
                      if (instantiationCallback == (UA_InstantiationCallback *)0x0) {
                        return 0;
                      }
                      (*instantiationCallback->method)
                                (node->nodeId,*local_40,instantiationCallback->handle);
                      return 0;
                    }
                  }
                }
              }
            }
          }
          else if (pUVar31->nodeClass == UA_NODECLASS_OBJECTTYPE) {
            cVar9 = (char)pUVar31[1].nodeId.namespaceIndex;
            goto joined_r0x0011dee5;
          }
        }
        p_Var36 = (server->config).logger;
        pUVar16 = session->channel;
        if (pUVar16 == (UA_SecureChannel *)0x0) {
          local_8c = 0;
          uVar14 = 0;
        }
        else {
          if (pUVar16->connection == (UA_Connection *)0x0) {
            local_8c = 0;
          }
          else {
            local_8c = pUVar16->connection->sockfd;
          }
          uVar14 = (pUVar16->securityToken).channelId;
        }
        uVar15 = (session->sessionId).identifier.numeric;
        uVar10 = (session->sessionId).identifier.guid.data2;
        uVar11 = (session->sessionId).identifier.guid.data3;
        bVar8 = (session->sessionId).identifier.guid.data4[0];
        bVar7 = (session->sessionId).identifier.guid.data4[1];
        bVar6 = (session->sessionId).identifier.guid.data4[2];
        bVar5 = (session->sessionId).identifier.guid.data4[3];
        bVar4 = (session->sessionId).identifier.guid.data4[4];
        bVar3 = (session->sessionId).identifier.guid.data4[5];
        bVar2 = (session->sessionId).identifier.guid.data4[6];
        bVar1 = (session->sessionId).identifier.guid.data4[7];
        pcVar32 = UA_StatusCode_name(UVar28);
        msg = 
        "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not instantiate the node witherror code %s"
        ;
        hierarchySize._0_4_ = local_8c;
      }
      else {
        subtypeId.identifier.string.length = (size_t)(node->nodeId).identifier.string.data;
        uVar17 = (node->nodeId).namespaceIndex;
        uVar18 = *(undefined2 *)&(node->nodeId).field_0x2;
        uVar19 = (node->nodeId).identifierType;
        sVar20 = (node->nodeId).identifier.string.length;
        subtypeId._0_4_ = SUB84(sVar20,0);
        subtypeId.identifierType = (UA_NodeIdType)(sVar20 >> 0x20);
        uVar21 = referenceTypeId->namespaceIndex;
        uVar22 = *(undefined2 *)&referenceTypeId->field_0x2;
        uVar23 = referenceTypeId->identifierType;
        UStack_168 = uVar17;
        uStack_166 = uVar18;
        UStack_164 = uVar19;
        subtypeId.identifier._8_2_ = uVar21;
        subtypeId.identifier._10_2_ = uVar22;
        subtypeId.identifier._12_4_ = uVar23;
        UVar28 = addReference(server,session,(UA_AddReferencesItem *)&stack0xfffffffffffffe98);
        if (UVar28 == 0) goto LAB_0011d967;
        p_Var36 = (server->config).logger;
        pUVar16 = session->channel;
        if (pUVar16 == (UA_SecureChannel *)0x0) {
          hierarchySize._0_4_ = 0;
          uVar14 = 0;
        }
        else {
          if (pUVar16->connection == (UA_Connection *)0x0) {
            hierarchySize._0_4_ = 0;
          }
          else {
            hierarchySize._0_4_ = pUVar16->connection->sockfd;
          }
          uVar14 = (pUVar16->securityToken).channelId;
        }
        uVar15 = (session->sessionId).identifier.numeric;
        uVar10 = (session->sessionId).identifier.guid.data2;
        uVar11 = (session->sessionId).identifier.guid.data3;
        bVar8 = (session->sessionId).identifier.guid.data4[0];
        bVar7 = (session->sessionId).identifier.guid.data4[1];
        bVar6 = (session->sessionId).identifier.guid.data4[2];
        bVar5 = (session->sessionId).identifier.guid.data4[3];
        bVar4 = (session->sessionId).identifier.guid.data4[4];
        bVar3 = (session->sessionId).identifier.guid.data4[5];
        bVar2 = (session->sessionId).identifier.guid.data4[6];
        bVar1 = (session->sessionId).identifier.guid.data4[7];
        pcVar32 = UA_StatusCode_name(UVar28);
        msg = 
        "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Could not add the reference to the parentwith error code %s"
        ;
      }
      UA_LOG_INFO(p_Var36,UA_LOGCATEGORY_SESSION,msg,(ulong)(uint)hierarchySize,(ulong)uVar14,
                  (ulong)uVar15,(ulong)uVar10,(ulong)uVar11,(ulong)bVar8,(ulong)bVar7,(ulong)bVar6,
                  (ulong)bVar5,(ulong)bVar4,(ulong)bVar3,(ulong)bVar2,(ulong)bVar1,pcVar32);
LAB_0011e2b8:
      deleteNode(server,&adminSession,&node->nodeId,true);
      return UVar28;
    }
    p_Var36 = (server->config).logger;
    pUVar16 = session->channel;
    if (pUVar16 == (UA_SecureChannel *)0x0) {
      uVar34 = 0;
      uVar37 = 0;
    }
    else {
      if (pUVar16->connection == (UA_Connection *)0x0) {
        uVar34 = 0;
      }
      else {
        uVar34 = (ulong)(uint)pUVar16->connection->sockfd;
      }
      uVar37 = (ulong)(pUVar16->securityToken).channelId;
    }
    uVar38 = (ulong)(session->sessionId).identifier.numeric;
    local_48 = (ulong)(session->sessionId).identifier.guid.data2;
    local_38 = (ulong)(session->sessionId).identifier.guid.data3;
    local_40 = (UA_NodeId *)(ulong)(session->sessionId).identifier.guid.data4[0];
    local_58 = (ulong)(session->sessionId).identifier.guid.data4[1];
    uVar42 = (ulong)(session->sessionId).identifier.guid.data4[2];
    uVar45 = (ulong)(session->sessionId).identifier.guid.data4[3];
    uVar44 = (ulong)(session->sessionId).identifier.guid.data4[4];
    uVar39 = (ulong)(session->sessionId).identifier.guid.data4[5];
    uVar40 = (ulong)(session->sessionId).identifier.guid.data4[6];
    uVar35 = (ulong)(session->sessionId).identifier.guid.data4[7];
    pcVar32 = 
    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Reference type to the parent invalid"
    ;
  }
LAB_0011d83f:
  UA_LOG_INFO(p_Var36,UA_LOGCATEGORY_SESSION,pcVar32,uVar34,uVar37,uVar38,local_48,local_38,local_40
              ,local_58,uVar42,uVar45,uVar44,uVar39,uVar40,uVar35);
  UVar28 = 0x804c0000;
LAB_0011dc8a:
  p_Var36 = (server->config).logger;
  pUVar16 = session->channel;
  if (pUVar16 == (UA_SecureChannel *)0x0) {
    UVar33 = 0;
    UVar13 = 0;
  }
  else {
    if (pUVar16->connection == (UA_Connection *)0x0) {
      UVar33 = 0;
    }
    else {
      UVar33 = pUVar16->connection->sockfd;
    }
    UVar13 = (pUVar16->securityToken).channelId;
  }
  uVar14 = (session->sessionId).identifier.numeric;
  uVar10 = (session->sessionId).identifier.guid.data2;
  uVar11 = (session->sessionId).identifier.guid.data3;
  bVar1 = (session->sessionId).identifier.guid.data4[0];
  bVar2 = (session->sessionId).identifier.guid.data4[1];
  bVar3 = (session->sessionId).identifier.guid.data4[2];
  bVar4 = (session->sessionId).identifier.guid.data4[3];
  bVar5 = (session->sessionId).identifier.guid.data4[4];
  bVar6 = (session->sessionId).identifier.guid.data4[5];
  bVar7 = (session->sessionId).identifier.guid.data4[6];
  bVar8 = (session->sessionId).identifier.guid.data4[7];
  pcVar32 = UA_StatusCode_name(UVar28);
  UA_LOG_INFO(p_Var36,UA_LOGCATEGORY_SESSION,
              "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | AddNodes: Checking the reference to the parent returned error code %s"
              ,UVar33,UVar13,(ulong)uVar14,(ulong)uVar10,(ulong)uVar11,(ulong)bVar1,(ulong)bVar2,
              (ulong)bVar3,(ulong)bVar4,(ulong)bVar5,(ulong)bVar6,(ulong)bVar7,(ulong)bVar8,pcVar32)
  ;
  UA_NodeStore_deleteNode(node);
  return UVar28;
}

Assistant:

UA_StatusCode
Service_AddNodes_existing(UA_Server *server, UA_Session *session, UA_Node *node,
                          const UA_NodeId *parentNodeId, const UA_NodeId *referenceTypeId,
                          const UA_NodeId *typeDefinition,
                          UA_InstantiationCallback *instantiationCallback,
                          UA_NodeId *addedNodeId) {
    UA_ASSERT_RCU_LOCKED();

    /* Check the namespaceindex */
    if(node->nodeId.namespaceIndex >= server->namespacesSize) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "AddNodes: Namespace invalid");
        UA_NodeStore_deleteNode(node);
        return UA_STATUSCODE_BADNODEIDINVALID;
    }

    /* Check the reference to the parent */
    UA_StatusCode retval = checkParentReference(server, session, node->nodeClass,
                                                parentNodeId, referenceTypeId);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "AddNodes: Checking the reference to the parent returned "
                            "error code %s", UA_StatusCode_name(retval));
        UA_NodeStore_deleteNode(node);
        return retval;
    }

    /* Add the node to the nodestore */
    retval = UA_NodeStore_insert(server->nodestore, node);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "AddNodes: Node could not be added to the nodestore "
                            "with error code %s", UA_StatusCode_name(retval));
        return retval;
    }

    /* Copy the nodeid if needed */
    if(addedNodeId) {
        retval = UA_NodeId_copy(&node->nodeId, addedNodeId);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not copy the nodeid");
            goto remove_node;
        }
    }

    /* Hierarchical reference back to the parent */
    if(!UA_NodeId_isNull(parentNodeId)) {
        UA_AddReferencesItem item;
        UA_AddReferencesItem_init(&item);
        item.sourceNodeId = node->nodeId;
        item.referenceTypeId = *referenceTypeId;
        item.isForward = false;
        item.targetNodeId.nodeId = *parentNodeId;
        retval = addReference(server, session, &item);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not add the reference to the parent"
                                "with error code %s", UA_StatusCode_name(retval));
            goto remove_node;
        }
    }

    /* Fall back to a default typedefinition for variables and objects */
    const UA_NodeId basedatavariabletype = UA_NODEID_NUMERIC(0, UA_NS0ID_BASEDATAVARIABLETYPE);
    const UA_NodeId baseobjecttype = UA_NODEID_NUMERIC(0, UA_NS0ID_BASEOBJECTTYPE);
    if(node->nodeClass == UA_NODECLASS_VARIABLE ||
       node->nodeClass == UA_NODECLASS_OBJECT) {
        if(!typeDefinition || UA_NodeId_isNull(typeDefinition)) {
            if(node->nodeClass == UA_NODECLASS_VARIABLE)
                typeDefinition = &basedatavariabletype;
            else
                typeDefinition = &baseobjecttype;
        }

        /* Instantiate variables and objects */
        retval = instantiateNode(server, session, &node->nodeId, node->nodeClass,
                                 typeDefinition, instantiationCallback);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "AddNodes: Could not instantiate the node with"
                                "error code %s", UA_StatusCode_name(retval));
            goto remove_node;
        }
    }

    /* Custom callback */
    if(instantiationCallback)
        instantiationCallback->method(node->nodeId, *typeDefinition,
                                      instantiationCallback->handle);
    return UA_STATUSCODE_GOOD;

 remove_node:
    deleteNode(server, &adminSession, &node->nodeId, true);
    return retval;
}